

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O2

int cuddZddSymmSiftingAux(DdManager *table,int x,int x_low,int x_high)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *moves;
  DdNode *pDVar5;
  DdSubtable *pDVar6;
  DdHalfWord *pDVar7;
  uint uVar8;
  ulong uVar9;
  uint initial_size;
  long lVar10;
  uint uVar11;
  DdHalfWord x_00;
  uint uVar12;
  DdNode *pDVar13;
  bool bVar14;
  
  initial_size = table->keysZ;
  uVar12 = x;
  while (uVar11 = x, x_low < (int)uVar12) {
    iVar2 = uVar12 - 1;
    iVar1 = cuddZddSymmCheck(table,iVar2,uVar12);
    if (iVar1 == 0) break;
    pDVar6 = table->subtableZ;
    uVar11 = pDVar6[iVar2].next;
    pDVar6[iVar2].next = uVar12;
    pDVar6[x].next = uVar11;
    uVar12 = uVar11;
  }
  do {
    if (x_high <= (int)uVar11) break;
    uVar12 = uVar11 + 1;
    iVar2 = cuddZddSymmCheck(table,uVar11,uVar12);
    if (iVar2 == 0) break;
    pDVar6 = table->subtableZ;
    uVar8 = uVar12;
    do {
      uVar3 = uVar8;
      uVar8 = pDVar6[(int)uVar3].next;
    } while (uVar3 < pDVar6[(int)uVar3].next);
    pDVar6[(int)uVar3].next = pDVar6[(int)uVar11].next;
    pDVar6[(int)uVar11].next = uVar12;
    uVar11 = uVar3;
  } while( true );
  if (x == x_low) {
    uVar12 = x;
    do {
      uVar11 = uVar12;
      uVar12 = table->subtableZ[(int)uVar11].next;
    } while (uVar11 < uVar12);
    pDVar4 = (DdNode *)cuddZddSymmSifting_down(table,uVar11,x_high,initial_size);
    if (pDVar4 == (DdNode *)0x0) {
      pDVar6 = table->subtableZ;
      uVar9 = (ulong)pDVar6[(int)uVar11].next;
LAB_00754ce5:
      iVar2 = (int)uVar9;
      do {
        uVar8 = (uint)uVar9;
        uVar9 = (ulong)pDVar6[(int)uVar8].next;
      } while (uVar8 < pDVar6[(int)uVar8].next);
      if (uVar11 - uVar12 != uVar8 - iVar2) {
        initial_size = table->keysZ;
LAB_00754d1d:
        pDVar5 = (DdNode *)cuddZddSymmSifting_up(table,iVar2,x,initial_size);
        moves = pDVar5;
LAB_00754d85:
        iVar2 = cuddZddSymmSiftingBackward(table,(Move *)pDVar5,initial_size);
        goto LAB_00754d8a;
      }
    }
    else {
      if (pDVar4 == (DdNode *)0x1) {
        return 0;
      }
      pDVar6 = table->subtableZ;
      uVar9 = (ulong)pDVar4->ref;
      if (pDVar6[uVar9].next != pDVar4->ref) goto LAB_00754ce5;
    }
    iVar2 = cuddZddSymmSiftingBackward(table,(Move *)pDVar4,initial_size);
    moves = (DdNode *)0x0;
LAB_00754d8a:
    if (iVar2 != 0) {
      while (pDVar4 != (DdNode *)0x0) {
        pDVar5 = (pDVar4->type).kids.T;
        pDVar4->ref = 0;
        pDVar4->next = table->nextFree;
        table->nextFree = pDVar4;
        pDVar4 = pDVar5;
      }
      while (moves != (DdNode *)0x0) {
        pDVar4 = (moves->type).kids.T;
        moves->ref = 0;
        moves->next = table->nextFree;
        table->nextFree = moves;
        moves = pDVar4;
      }
      return 1;
    }
  }
  else {
    if (x_high == x) {
      uVar12 = x;
      do {
        uVar11 = table->subtableZ[(int)uVar12].next;
        bVar14 = uVar12 < uVar11;
        uVar12 = uVar11;
      } while (bVar14);
      do {
        uVar8 = uVar12;
        uVar12 = table->subtableZ[(int)uVar8].next;
      } while (uVar8 < uVar12);
      moves = (DdNode *)cuddZddSymmSifting_up(table,uVar11,x_low,initial_size);
      if (moves == (DdNode *)0x1) {
        return 0;
      }
      if (moves == (DdNode *)0x0) {
        uVar3 = uVar11;
        do {
          uVar12 = uVar3;
          uVar3 = table->subtableZ[(int)uVar12].next;
        } while (uVar12 < uVar3);
LAB_00754d48:
        if (uVar8 - uVar11 != uVar12 - uVar3) {
          initial_size = table->keysZ;
          pDVar5 = (DdNode *)cuddZddSymmSifting_down(table,uVar12,x,initial_size);
          pDVar4 = pDVar5;
          goto LAB_00754d85;
        }
      }
      else {
        uVar12 = moves->index;
        if (table->subtableZ[uVar12].next != uVar12) {
          uVar3 = table->subtableZ[(int)uVar12].next;
          goto LAB_00754d48;
        }
      }
      iVar2 = cuddZddSymmSiftingBackward(table,(Move *)moves,initial_size);
      pDVar4 = (DdNode *)0x0;
      goto LAB_00754d8a;
    }
    if (x - x_low <= x_high - x) {
      do {
        uVar12 = table->subtableZ[x].next;
        bVar14 = (uint)x < uVar12;
        x = uVar12;
      } while (bVar14);
      moves = (DdNode *)cuddZddSymmSifting_up(table,uVar12,x_low,initial_size);
      if (moves == (DdNode *)0x1) {
        return 0;
      }
      if (moves == (DdNode *)0x0) {
        do {
          x_00 = uVar12;
          lVar10 = (long)(int)x_00;
          uVar12 = table->subtableZ[lVar10].next;
        } while (x_00 < uVar12);
      }
      else {
        x_00 = moves->index;
        lVar10 = (long)(int)x_00;
        uVar12 = table->subtableZ[lVar10].next;
      }
      pDVar4 = (DdNode *)cuddZddSymmSifting_down(table,x_00,x_high,initial_size);
      pDVar5 = pDVar4;
      if (pDVar4 == (DdNode *)0x0) {
        pDVar6 = table->subtableZ;
        uVar9 = (ulong)pDVar6[lVar10].next;
      }
      else {
        if (pDVar4 == (DdNode *)0x1) goto LAB_00754f47;
        pDVar6 = table->subtableZ;
        uVar9 = (ulong)pDVar4->ref;
        if (pDVar6[uVar9].next == pDVar4->ref) goto LAB_00754d85;
      }
      iVar2 = (int)uVar9;
      do {
        uVar11 = (uint)uVar9;
        uVar9 = (ulong)pDVar6[(int)uVar11].next;
      } while (uVar11 < pDVar6[(int)uVar11].next);
      if (x_00 - uVar12 == uVar11 - iVar2) goto LAB_00754d85;
      while (moves != (DdNode *)0x0) {
        pDVar5 = (moves->type).kids.T;
        moves->ref = 0;
        moves->next = table->nextFree;
        table->nextFree = moves;
        moves = pDVar5;
      }
      initial_size = table->keysZ;
      x = x_low;
      goto LAB_00754d1d;
    }
    do {
      uVar12 = x;
      x = table->subtableZ[(int)uVar12].next;
    } while (uVar12 < (uint)x);
    pDVar4 = (DdNode *)cuddZddSymmSifting_down(table,uVar12,x_high,initial_size);
    if (pDVar4 == (DdNode *)0x0) {
      pDVar6 = table->subtableZ;
      pDVar7 = &pDVar6[(int)uVar12].next;
    }
    else {
      if (pDVar4 == (DdNode *)0x1) {
        return 0;
      }
      pDVar7 = &pDVar4->ref;
      pDVar6 = table->subtableZ;
    }
    uVar12 = *pDVar7;
    uVar11 = uVar12;
    do {
      uVar8 = uVar11;
      uVar11 = pDVar6[(int)uVar8].next;
    } while (uVar8 < pDVar6[(int)uVar8].next);
    moves = (DdNode *)cuddZddSymmSifting_up(table,uVar12,x_low,initial_size);
    if (moves != (DdNode *)0x1) {
      pDVar5 = moves;
      if (moves == (DdNode *)0x0) {
        uVar3 = uVar12;
        do {
          uVar11 = uVar3;
          uVar3 = table->subtableZ[(int)uVar11].next;
        } while (uVar11 < uVar3);
      }
      else {
        uVar11 = moves->index;
        if (table->subtableZ[uVar11].next == uVar11) goto LAB_00754d85;
        uVar3 = table->subtableZ[(int)uVar11].next;
      }
      if (uVar8 - uVar12 != uVar11 - uVar3) {
        while (pDVar4 != (DdNode *)0x0) {
          pDVar5 = (pDVar4->type).kids.T;
          pDVar4->ref = 0;
          pDVar4->next = table->nextFree;
          table->nextFree = pDVar4;
          pDVar4 = pDVar5;
        }
        initial_size = table->keysZ;
        pDVar5 = (DdNode *)cuddZddSymmSifting_down(table,uVar11,x_high,initial_size);
        pDVar4 = pDVar5;
      }
      goto LAB_00754d85;
    }
    moves = (DdNode *)0x1;
  }
  if ((DdNode *)0x1 < pDVar4) {
    pDVar5 = table->nextFree;
    do {
      pDVar13 = pDVar4;
      pDVar4 = (pDVar13->type).kids.T;
      pDVar13->ref = 0;
      pDVar13->next = pDVar5;
      pDVar5 = pDVar13;
    } while (pDVar4 != (DdNode *)0x0);
    table->nextFree = pDVar13;
  }
LAB_00754f47:
  if ((DdNode *)0x1 < moves) {
    pDVar4 = table->nextFree;
    do {
      pDVar5 = moves;
      moves = (pDVar5->type).kids.T;
      pDVar5->ref = 0;
      pDVar5->next = pDVar4;
      pDVar4 = pDVar5;
    } while (moves != (DdNode *)0x0);
    table->nextFree = pDVar5;
  }
  return 0;
}

Assistant:

static int
cuddZddSymmSiftingAux(
  DdManager * table,
  int  x,
  int  x_low,
  int  x_high)
{
    Move *move;
    Move *move_up;      /* list of up move */
    Move *move_down;    /* list of down move */
    int  initial_size;
    int  result;
    int  i;
    int  topbot;        /* index to either top or bottom of symmetry group */
    int  init_group_size, final_group_size;

    initial_size = table->keysZ;

    move_down = NULL;
    move_up = NULL;

    /* Look for consecutive symmetries above x. */
    for (i = x; i > x_low; i--) {
        if (!cuddZddSymmCheck(table, i - 1, i))
            break;
        /* find top of i-1's symmetry */
        topbot = table->subtableZ[i - 1].next;
        table->subtableZ[i - 1].next = i;
        table->subtableZ[x].next = topbot;
        /* x is bottom of group so its symmetry is top of i-1's
           group */
        i = topbot + 1; /* add 1 for i--, new i is top of symm group */
    }
    /* Look for consecutive symmetries below x. */
    for (i = x; i < x_high; i++) {
        if (!cuddZddSymmCheck(table, i, i + 1))
            break;
        /* find bottom of i+1's symm group */
        topbot = i + 1;
        while ((unsigned) topbot < table->subtableZ[topbot].next)
            topbot = table->subtableZ[topbot].next;

        table->subtableZ[topbot].next = table->subtableZ[i].next;
        table->subtableZ[i].next = i + 1;
        i = topbot - 1; /* add 1 for i++,
                           new i is bottom of symm group */
    }

    /* Now x maybe in the middle of a symmetry group. */
    if (x == x_low) { /* Sift down */
        /* Find bottom of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;

        i = table->subtableZ[x].next;
        init_group_size = x - i + 1;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down == NULL ||
            table->subtableZ[move_down->y].next != move_down->y) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_down != NULL)
                x = move_down->y;
            else
                x = table->subtableZ[x].next;
            i = x;
            while ((unsigned) i < table->subtableZ[i].next) {
                i = table->subtableZ[i].next;
            }
            final_group_size = i - x + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table,
                    move_down, initial_size);
            }
            else {
                initial_size = table->keysZ;
                move_up = cuddZddSymmSifting_up(table, x, x_low,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_down,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else if (x == x_high) { /* Sift up */
        /* Find top of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
        x = table->subtableZ[x].next;

        i = x;
        while ((unsigned) i < table->subtableZ[i].next) {
            i = table->subtableZ[i].next;
        }
        init_group_size = i - x + 1;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        /* after that point x --> x_low, unless early term */
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up == NULL ||
            table->subtableZ[move_up->x].next != move_up->x) {
            /* symmetry detected may have to make another complete
                pass */
            if (move_up != NULL)
                x = move_up->x;
            else {
                while ((unsigned) x < table->subtableZ[x].next)
                    x = table->subtableZ[x].next;
            }
            i = table->subtableZ[x].next;
            final_group_size = x - i + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
            else {
                initial_size = table->keysZ;
                move_down = cuddZddSymmSifting_down(table, x, x_high,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_up,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else if ((x - x_low) > (x_high - x)) { /* must go down first:
                                                shorter */
        /* Find bottom of x's symm group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down != NULL) {
            x = move_down->y;
        }
        else {
            x = table->subtableZ[x].next;
        }
        i = x;
        while ((unsigned) i < table->subtableZ[i].next) {
            i = table->subtableZ[i].next;
        }
        init_group_size = i - x + 1;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up == NULL ||
            table->subtableZ[move_up->x].next != move_up->x) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_up != NULL) {
                x = move_up->x;
            }
            else {
                while ((unsigned) x < table->subtableZ[x].next)
                    x = table->subtableZ[x].next;
            }
            i = table->subtableZ[x].next;
            final_group_size = x - i + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetry groups detected,
                   return to best position */
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
            else {
                while (move_down != NULL) {
                    move = move_down->next;
                    cuddDeallocMove(table, move_down);
                    move_down = move;
                }
                initial_size = table->keysZ;
                move_down = cuddZddSymmSifting_down(table, x, x_high,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_up,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }
    else { /* moving up first:shorter */
        /* Find top of x's symmetry group */
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
        x = table->subtableZ[x].next;

        move_up = cuddZddSymmSifting_up(table, x, x_low, initial_size);
        /* after that point x --> x_high, unless early term */
        if (move_up == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_up != NULL) {
            x = move_up->x;
        }
        else {
            while ((unsigned) x < table->subtableZ[x].next)
                x = table->subtableZ[x].next;
        }
        i = table->subtableZ[x].next;
        init_group_size = x - i + 1;

        move_down = cuddZddSymmSifting_down(table, x, x_high,
            initial_size);
        if (move_down == ZDD_MV_OOM)
            goto cuddZddSymmSiftingAuxOutOfMem;

        if (move_down == NULL ||
            table->subtableZ[move_down->y].next != move_down->y) {
            /* symmetry detected may have to make another complete
               pass */
            if (move_down != NULL) {
                x = move_down->y;
            }
            else {
                x = table->subtableZ[x].next;
            }
            i = x;
            while ((unsigned) i < table->subtableZ[i].next) {
                i = table->subtableZ[i].next;
            }
            final_group_size = i - x + 1;

            if (init_group_size == final_group_size) {
                /* No new symmetries detected,
                   go back to best position */
                result = cuddZddSymmSiftingBackward(table, move_down,
                    initial_size);
            }
            else {
                while (move_up != NULL) {
                    move = move_up->next;
                    cuddDeallocMove(table, move_up);
                    move_up = move;
                }
                initial_size = table->keysZ;
                move_up = cuddZddSymmSifting_up(table, x, x_low,
                    initial_size);
                result = cuddZddSymmSiftingBackward(table, move_up,
                    initial_size);
            }
        }
        else {
            result = cuddZddSymmSiftingBackward(table, move_down,
                initial_size);
            /* move backward and stop at best position */
        }
        if (!result)
            goto cuddZddSymmSiftingAuxOutOfMem;
    }

    while (move_down != NULL) {
        move = move_down->next;
        cuddDeallocMove(table, move_down);
        move_down = move;
    }
    while (move_up != NULL) {
        move = move_up->next;
        cuddDeallocMove(table, move_up);
        move_up = move;
    }

    return(1);

cuddZddSymmSiftingAuxOutOfMem:
    if (move_down != ZDD_MV_OOM) {
        while (move_down != NULL) {
            move = move_down->next;
            cuddDeallocMove(table, move_down);
            move_down = move;
        }
    }
    if (move_up != ZDD_MV_OOM) {
        while (move_up != NULL) {
            move = move_up->next;
            cuddDeallocMove(table, move_up);
            move_up = move;
        }
    }

    return(0);

}